

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O0

void __thiscall KDReports::Test::testTextId(Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QString local_308;
  QString local_2f0;
  QString local_2d8;
  QString local_2c0;
  QString local_2a8;
  QString local_290;
  QString local_278;
  QString local_260;
  QString local_248;
  QString local_230;
  QString local_218;
  QString local_200;
  QString local_1e8;
  QString local_1d0;
  QString local_1b8;
  QString local_1a0;
  QString local_188;
  QString local_170;
  QString local_158;
  QString local_140;
  QString local_128;
  QString local_110;
  QString local_f8;
  QString local_e0;
  QString local_c8;
  QString local_b0;
  QString local_98;
  QString local_80;
  Report local_68 [8];
  Report report;
  QFlags<QIODeviceBase::OpenModeFlag> local_48 [4];
  QString local_38;
  QFile local_20 [8];
  QFile file;
  Test *this_local;
  
  QString::QString(&local_38,":/textid.xml");
  QFile::QFile(local_20,(QString *)&local_38);
  QString::~QString(&local_38);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(local_48,ReadOnly);
  bVar1 = QFile::open((QFlags_conflict *)local_20);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x2c);
  if ((bVar1 & 1) != 0) {
    KDReports::Report::Report(local_68,(QObject *)0x0);
    QString::QString(&local_80,"1");
    QString::QString(&local_98,"Ti");
    KDReports::Report::associateTextValue((QString *)local_68,(QString *)&local_80);
    QString::~QString(&local_98);
    QString::~QString(&local_80);
    QString::QString(&local_b0,"2");
    QString::QString(&local_c8,"tle");
    KDReports::Report::associateTextValue((QString *)local_68,(QString *)&local_b0);
    QString::~QString(&local_c8);
    QString::~QString(&local_b0);
    QString::QString(&local_e0,"3");
    QString::QString(&local_f8,"textid.xml");
    KDReports::Report::associateTextValue((QString *)local_68,(QString *)&local_e0);
    QString::~QString(&local_f8);
    QString::~QString(&local_e0);
    bVar1 = KDReports::Report::loadFromXML((QIODevice *)local_68,(ErrorDetails *)local_20);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x31);
    if ((bVar1 & 1) != 0) {
      KDReports::Report::mainTextDocument();
      iVar3 = QTextDocument::blockCount();
      bVar1 = QTest::qCompare(iVar3,4,"report.mainTextDocument()->blockCount()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x32);
      if ((bVar1 & 1) != 0) {
        KDReports::Report::mainTextDocument();
        QTextDocument::toPlainText();
        QString::QString(&local_128,"Title .\ntextid.xml\n\n");
        bVar2 = QTest::qCompare(&local_110,&local_128,"report.mainTextDocument()->toPlainText()",
                                "QString(\"Title .\\ntextid.xml\\n\\n\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x33);
        QString::~QString(&local_128);
        QString::~QString(&local_110);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          QString::QString(&local_140,"1");
          QString::QString(&local_158,"New Ti");
          KDReports::Report::associateTextValue((QString *)local_68,(QString *)&local_140);
          QString::~QString(&local_158);
          QString::~QString(&local_140);
          KDReports::Report::mainTextDocument();
          QTextDocument::toPlainText();
          QString::QString(&local_188,"New Title .\ntextid.xml\n\n");
          bVar2 = QTest::qCompare(&local_170,&local_188,"report.mainTextDocument()->toPlainText()",
                                  "QString(\"New Title .\\ntextid.xml\\n\\n\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x37);
          QString::~QString(&local_188);
          QString::~QString(&local_170);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            QString::QString(&local_1a0,"3");
            QString::QString(&local_1b8,"changed");
            KDReports::Report::associateTextValue((QString *)local_68,(QString *)&local_1a0);
            QString::~QString(&local_1b8);
            QString::~QString(&local_1a0);
            KDReports::Report::mainTextDocument();
            QTextDocument::toPlainText();
            QString::QString(&local_1e8,"New Title .\nchanged\n\n");
            bVar2 = QTest::qCompare(&local_1d0,&local_1e8,"report.mainTextDocument()->toPlainText()"
                                    ,"QString(\"New Title .\\nchanged\\n\\n\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                    ,0x3a);
            QString::~QString(&local_1e8);
            QString::~QString(&local_1d0);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              QString::QString(&local_200,"1");
              QString::QString(&local_218,"Newer Ti");
              KDReports::Report::associateTextValue((QString *)local_68,(QString *)&local_200);
              QString::~QString(&local_218);
              QString::~QString(&local_200);
              KDReports::Report::mainTextDocument();
              QTextDocument::toPlainText();
              QString::QString(&local_248,"Newer Title .\nchanged\n\n");
              bVar2 = QTest::qCompare(&local_230,&local_248,
                                      "report.mainTextDocument()->toPlainText()",
                                      "QString(\"Newer Title .\\nchanged\\n\\n\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                      ,0x3c);
              QString::~QString(&local_248);
              QString::~QString(&local_230);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                QString::QString(&local_260,"5");
                QString::QString(&local_278,"well");
                KDReports::Report::associateTextValue((QString *)local_68,(QString *)&local_260);
                QString::~QString(&local_278);
                QString::~QString(&local_260);
                KDReports::Report::mainTextDocument();
                QTextDocument::toPlainText();
                QString::QString(&local_2a8,"Newer Title .\nchanged\n\nwell");
                bVar2 = QTest::qCompare(&local_290,&local_2a8,
                                        "report.mainTextDocument()->toPlainText()",
                                        "QString(\"Newer Title .\\nchanged\\n\\nwell\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                        ,0x3f);
                QString::~QString(&local_2a8);
                QString::~QString(&local_290);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  QString::QString(&local_2c0,"4");
                  QString::QString(&local_2d8,"works");
                  KDReports::Report::associateTextValue((QString *)local_68,(QString *)&local_2c0);
                  QString::~QString(&local_2d8);
                  QString::~QString(&local_2c0);
                  KDReports::Report::mainTextDocument();
                  QTextDocument::toPlainText();
                  QString::QString(&local_308,"Newer Title .\nchanged\nworks\nwell");
                  QTest::qCompare(&local_2f0,&local_308,"report.mainTextDocument()->toPlainText()",
                                  "QString(\"Newer Title .\\nchanged\\nworks\\nwell\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x42);
                  QString::~QString(&local_308);
                  QString::~QString(&local_2f0);
                }
              }
            }
          }
        }
      }
    }
    KDReports::Report::~Report(local_68);
  }
  QFile::~QFile(local_20);
  return;
}

Assistant:

void testTextId()
    {
        QFile file(":/textid.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        report.associateTextValue("1", "Ti");
        report.associateTextValue("2", "tle");
        report.associateTextValue("3", "textid.xml");
        QVERIFY(report.loadFromXML(&file));
        QCOMPARE(report.mainTextDocument()->blockCount(), 4);
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Title .\ntextid.xml\n\n"));

        // Now test changing text values -after- loading.
        report.associateTextValue("1", "New Ti");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("New Title .\ntextid.xml\n\n"));

        report.associateTextValue("3", "changed");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("New Title .\nchanged\n\n"));
        report.associateTextValue("1", "Newer Ti");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\n\n"));

        report.associateTextValue("5", "well");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\n\nwell"));

        report.associateTextValue("4", "works");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\nworks\nwell"));
    }